

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O2

bool helics::operator==(SmallBuffer *sb1,SmallBuffer *sb2)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  
  __y._M_str = (char *)sb2->heap;
  __y._M_len = sb2->bufferSize;
  __x._M_str = (char *)sb1->heap;
  __x._M_len = sb1->bufferSize;
  bVar1 = std::operator==(__x,__y);
  return bVar1;
}

Assistant:

std::string_view to_string() const
    {
        return std::string_view{reinterpret_cast<const char*>(heap), bufferSize};
    }